

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::SumState<long>,short,duckdb::IntegerSumOperation>
               (short *idata,AggregateInputData *aggr_input_data,SumState<long> *state,idx_t count,
               ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar5 = 0;
  uVar4 = 0;
  do {
    if (uVar4 == count + 0x3f >> 6) {
      return;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar6 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar6 = count;
      }
LAB_00af4361:
      for (; uVar3 = uVar5, uVar5 < uVar6; uVar5 = uVar5 + 1) {
        state->isset = true;
        state->value = state->value + (long)idata[uVar5];
      }
    }
    else {
      uVar2 = puVar1[uVar4];
      uVar6 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar6 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_00af4361;
      uVar3 = uVar6;
      if (uVar2 != 0) {
        for (uVar7 = 0; uVar3 = uVar5 + uVar7, uVar5 + uVar7 < uVar6; uVar7 = uVar7 + 1) {
          if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
            state->isset = true;
            state->value = state->value + (long)idata[uVar5 + uVar7];
          }
        }
      }
    }
    uVar5 = uVar3;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

static inline void NullaryScatterLoop(STATE_TYPE **__restrict states, AggregateInputData &aggr_input_data,
	                                      const SelectionVector &ssel, idx_t count) {

		for (idx_t i = 0; i < count; i++) {
			auto sidx = ssel.get_index(i);
			OP::template Operation<STATE_TYPE, OP>(*states[sidx], aggr_input_data, sidx);
		}
	}